

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O3

string * __thiscall
lest::
to_string<nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>,nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>>
          (string *__return_storage_ptr__,lest *this,
          basic_string_view<char,_std::char_traits<char>_> *lhs,string *op,
          basic_string_view<char,_std::char_traits<char>_> *rhs)

{
  pointer pcVar1;
  ostream *poVar2;
  ostringstream os;
  size_type *local_208;
  size_type local_200;
  size_type local_1f8;
  undefined8 uStack_1f0;
  size_type *local_1e8;
  size_type local_1e0;
  size_type local_1d8;
  undefined8 uStack_1d0;
  size_type *local_1c8;
  size_type local_1c0;
  size_type local_1b8;
  undefined8 uStack_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  local_208 = &local_1f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_208,*(long *)this,*(long *)(this + 8) + *(long *)this);
  local_1c8 = local_208;
  if (local_208 == &local_1f8) {
    uStack_1b0 = uStack_1f0;
    local_1c8 = &local_1b8;
  }
  local_1b8 = local_1f8;
  local_1c0 = local_200;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(char *)local_1c8,local_200);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,lhs->data_,lhs->size_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  pcVar1 = (op->_M_dataplus)._M_p;
  local_208 = &local_1f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_208,pcVar1,pcVar1 + op->_M_string_length);
  local_1e8 = local_208;
  if (local_208 == &local_1f8) {
    uStack_1d0 = uStack_1f0;
    local_1e8 = &local_1d8;
  }
  local_1d8 = local_1f8;
  local_1e0 = local_200;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_1e8,local_200);
  if (local_1e8 != &local_1d8) {
    operator_delete(local_1e8,local_1d8 + 1);
  }
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8,local_1b8 + 1);
  }
  std::__cxx11::stringbuf::str();
  if (local_208 == &local_1f8) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_1f8;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_1f0;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_208;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_1f8;
  }
  __return_storage_ptr__->_M_string_length = local_200;
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string( L const & lhs, std::string op, R const & rhs )
{
    std::ostringstream os; os << to_string( lhs ) << " " << op << " " << to_string( rhs ); return os.str();
}